

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

size_t Curl_trailers_read(char *buffer,size_t size,size_t nitems,void *raw)

{
  ulong uVar1;
  ulong __n;
  
  uVar1 = (*(long **)((long)raw + 0x1588))[2] - *(long *)((long)raw + 0x1580);
  __n = size * nitems;
  if (uVar1 <= size * nitems) {
    __n = uVar1;
  }
  if (__n != 0) {
    memcpy(buffer,(void *)(*(long *)((long)raw + 0x1580) + **(long **)((long)raw + 0x1588)),__n);
    *(long *)((long)raw + 0x1580) = *(long *)((long)raw + 0x1580) + __n;
  }
  return __n;
}

Assistant:

static size_t Curl_trailers_read(char *buffer, size_t size, size_t nitems,
                                 void *raw)
{
  struct Curl_easy *data = (struct Curl_easy *)raw;
  Curl_send_buffer *trailers_buf = data->state.trailers_buf;
  size_t bytes_left = trailers_buf->size_used-data->state.trailers_bytes_sent;
  size_t to_copy = (size*nitems < bytes_left) ? size*nitems : bytes_left;
  if(to_copy) {
    memcpy(buffer,
           &trailers_buf->buffer[data->state.trailers_bytes_sent],
           to_copy);
    data->state.trailers_bytes_sent += to_copy;
  }
  return to_copy;
}